

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opencv_demo.cc
# Opt level: O0

int main(int argc,char **argv)

{
  undefined8 uVar1;
  byte bVar2;
  int iVar3;
  int iVar4;
  undefined8 uVar5;
  ostream *poVar6;
  char *__s1;
  apriltag_detector_t *td_00;
  char *pcVar7;
  double dVar8;
  _InputArray local_500;
  allocator<char> local_4e1;
  string local_4e0 [32];
  Scalar_<double> local_4c0;
  Point_<int> local_4a0;
  _InputOutputArray local_498;
  int local_47c;
  int local_478;
  Size textsize;
  int baseline;
  double fontscale;
  string local_460 [4];
  int fontface;
  String text;
  stringstream ss;
  ostream local_430 [376];
  Scalar_<double> local_2b8;
  Point_<int> local_298;
  Point_<int> local_290;
  _InputOutputArray local_288;
  Scalar_<double> local_270;
  Point_<int> local_250;
  Point_<int> local_248;
  _InputOutputArray local_240;
  Scalar_<double> local_228;
  Point_<int> local_208;
  Point_<int> local_200;
  _InputOutputArray local_1f8;
  Scalar_<double> local_1e0;
  Point_<int> local_1c0;
  Point_<int> local_1b8;
  _InputOutputArray local_1b0;
  long local_198;
  apriltag_detection_t *det;
  zarray_t *pzStack_188;
  int i;
  zarray_t *detections;
  image_u8_t im;
  _InputArray local_150;
  Mat local_138 [8];
  Mat gray;
  Mat local_d8 [8];
  Mat frame;
  apriltag_detector_t *td;
  char *famname;
  apriltag_family_t *tf;
  VideoCapture local_50 [8];
  VideoCapture cap;
  getopt_t *getopt;
  char **argv_local;
  int argc_local;
  
  uVar5 = getopt_create();
  getopt_add_bool(uVar5,0x68,"help",0,"Show this help");
  getopt_add_bool(uVar5,100,"debug",1,"Enable debugging output (slow)");
  getopt_add_bool(uVar5,0x71,"quiet",0,"Reduce output");
  getopt_add_string(uVar5,0x66,"family","tag36h11","Tag family to use");
  getopt_add_int(uVar5,0x74,"threads","1","Use this many CPU threads");
  getopt_add_double(uVar5,0x78,"decimate","1.0","Decimate input image by this factor");
  getopt_add_double(uVar5,0x62,"blur","0.0","Apply low-pass blur to input");
  pcVar7 = "Spend more time trying to align edges of tags";
  getopt_add_bool(uVar5,0x30,"refine-edges",1);
  iVar3 = getopt_parse(uVar5,argc,argv,1);
  if ((iVar3 != 0) && (iVar3 = getopt_get_bool(uVar5,"help"), iVar3 == 0)) {
    cv::VideoCapture::VideoCapture(local_50,0,0);
    bVar2 = cv::VideoCapture::isOpened();
    if ((bVar2 & 1) == 0) {
      poVar6 = std::operator<<((ostream *)&std::cerr,"Couldn\'t open video capture device");
      std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
      argv_local._4_4_ = -1;
    }
    else {
      __s1 = (char *)getopt_get_string(uVar5,"family");
      iVar3 = strcmp(__s1,"tag36h11");
      if (iVar3 == 0) {
        famname = (char *)tag36h11_create();
      }
      else {
        iVar3 = strcmp(__s1,"tag25h9");
        if (iVar3 == 0) {
          famname = (char *)tag25h9_create();
        }
        else {
          iVar3 = strcmp(__s1,"tag16h5");
          if (iVar3 == 0) {
            famname = (char *)tag16h5_create();
          }
          else {
            iVar3 = strcmp(__s1,"tagCircle21h7");
            if (iVar3 == 0) {
              famname = (char *)tagCircle21h7_create();
            }
            else {
              iVar3 = strcmp(__s1,"tagCircle49h12");
              if (iVar3 == 0) {
                famname = (char *)tagCircle49h12_create();
              }
              else {
                iVar3 = strcmp(__s1,"tagStandard41h12");
                if (iVar3 == 0) {
                  famname = (char *)tagStandard41h12_create();
                }
                else {
                  iVar3 = strcmp(__s1,"tagStandard52h13");
                  if (iVar3 != 0) {
                    printf("Unrecognized tag family name. Use e.g. \"tag36h11\".\n");
                    exit(-1);
                  }
                  famname = (char *)tagStandard52h13_create();
                }
              }
            }
          }
        }
      }
      td_00 = (apriltag_detector_t *)apriltag_detector_create();
      apriltag_detector_add_family(td_00,(apriltag_family_t *)famname);
      dVar8 = (double)getopt_get_double(uVar5,"decimate");
      td_00->quad_decimate = (float)dVar8;
      dVar8 = (double)getopt_get_double(uVar5,"blur");
      td_00->quad_sigma = (float)dVar8;
      iVar3 = getopt_get_int(uVar5,"threads");
      td_00->nthreads = iVar3;
      iVar3 = getopt_get_bool(uVar5,"debug");
      td_00->debug = iVar3;
      iVar3 = getopt_get_bool(uVar5,"refine-edges");
      td_00->refine_edges = iVar3;
      cv::Mat::Mat(local_d8);
      cv::Mat::Mat(local_138);
      do {
        cv::VideoCapture::operator>>(local_50,local_d8);
        cv::_InputArray::_InputArray(&local_150,local_d8);
        cv::_OutputArray::_OutputArray((_OutputArray *)&im.buf,local_138);
        cv::cvtColor((cv *)&local_150,(_InputArray *)&im.buf,(_OutputArray *)0x6,0,(int)pcVar7);
        cv::_OutputArray::~_OutputArray((_OutputArray *)&im.buf);
        cv::_InputArray::~_InputArray(&local_150);
        detections._4_4_ = _gray;
        pzStack_188 = (zarray_t *)apriltag_detector_detect(td_00,&detections);
        iVar3 = zarray_size(pzStack_188);
        poVar6 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,iVar3);
        poVar6 = std::operator<<(poVar6," tags detected");
        std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
        for (det._4_4_ = 0; iVar3 = det._4_4_, iVar4 = zarray_size(pzStack_188), iVar3 < iVar4;
            det._4_4_ = det._4_4_ + 1) {
          zarray_get(pzStack_188,det._4_4_,&local_198);
          cv::_InputOutputArray::_InputOutputArray(&local_1b0,local_d8);
          cv::Point_<int>::Point_
                    (&local_1b8,(int)*(double *)(local_198 + 0x30),
                     (int)*(double *)(local_198 + 0x38));
          cv::Point_<int>::Point_
                    (&local_1c0,(int)*(double *)(local_198 + 0x40),
                     (int)*(double *)(local_198 + 0x48));
          cv::Scalar_<double>::Scalar_(&local_1e0,0.0,255.0,0.0,0.0);
          cv::line(&local_1b0,&local_1b8,&local_1c0,&local_1e0,2,8,0);
          cv::_InputOutputArray::~_InputOutputArray(&local_1b0);
          cv::_InputOutputArray::_InputOutputArray(&local_1f8,local_d8);
          cv::Point_<int>::Point_
                    (&local_200,(int)*(double *)(local_198 + 0x30),
                     (int)*(double *)(local_198 + 0x38));
          cv::Point_<int>::Point_
                    (&local_208,(int)*(double *)(local_198 + 0x60),
                     (int)*(double *)(local_198 + 0x68));
          cv::Scalar_<double>::Scalar_(&local_228,0.0,0.0,255.0,0.0);
          cv::line(&local_1f8,&local_200,&local_208,&local_228,2,8,0);
          cv::_InputOutputArray::~_InputOutputArray(&local_1f8);
          cv::_InputOutputArray::_InputOutputArray(&local_240,local_d8);
          cv::Point_<int>::Point_
                    (&local_248,(int)*(double *)(local_198 + 0x40),
                     (int)*(double *)(local_198 + 0x48));
          cv::Point_<int>::Point_
                    (&local_250,(int)*(double *)(local_198 + 0x50),
                     (int)*(double *)(local_198 + 0x58));
          cv::Scalar_<double>::Scalar_(&local_270,255.0,0.0,0.0,0.0);
          cv::line(&local_240,&local_248,&local_250,&local_270,2,8,0);
          cv::_InputOutputArray::~_InputOutputArray(&local_240);
          cv::_InputOutputArray::_InputOutputArray(&local_288,local_d8);
          cv::Point_<int>::Point_
                    (&local_290,(int)*(double *)(local_198 + 0x50),
                     (int)*(double *)(local_198 + 0x58));
          cv::Point_<int>::Point_
                    (&local_298,(int)*(double *)(local_198 + 0x60),
                     (int)*(double *)(local_198 + 0x68));
          cv::Scalar_<double>::Scalar_(&local_2b8,255.0,0.0,0.0,0.0);
          cv::line(&local_288,&local_290,&local_298,&local_2b8,2,8,0);
          cv::_InputOutputArray::~_InputOutputArray(&local_288);
          std::__cxx11::stringstream::stringstream((stringstream *)(text.field_2._M_local_buf + 8));
          std::ostream::operator<<(local_430,*(int *)(local_198 + 8));
          std::__cxx11::stringstream::str();
          stack0xfffffffffffffb90 = 0x3ff0000000000000;
          cv::getTextSize((string *)&local_47c,(int)local_460,1.0,6,(int *)0x2);
          cv::_InputOutputArray::_InputOutputArray(&local_498,local_d8);
          cv::Point_<int>::Point_
                    (&local_4a0,(int)(*(double *)(local_198 + 0x20) - (double)(local_47c / 2)),
                     (int)(*(double *)(local_198 + 0x28) + (double)(local_478 / 2)));
          uVar1 = stack0xfffffffffffffb90;
          cv::Scalar_<double>::Scalar_(&local_4c0,255.0,153.0,0.0,0.0);
          pcVar7 = (char *)&local_4c0;
          cv::putText(uVar1,&local_498,local_460,&local_4a0,6,pcVar7,2,8,0);
          cv::_InputOutputArray::~_InputOutputArray(&local_498);
          std::__cxx11::string::~string(local_460);
          std::__cxx11::stringstream::~stringstream((stringstream *)(text.field_2._M_local_buf + 8))
          ;
        }
        zarray_destroy(pzStack_188);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>(local_4e0,"Tag Detections",&local_4e1);
        cv::_InputArray::_InputArray(&local_500,local_d8);
        cv::imshow(local_4e0,&local_500);
        cv::_InputArray::~_InputArray(&local_500);
        std::__cxx11::string::~string(local_4e0);
        std::allocator<char>::~allocator(&local_4e1);
        iVar3 = cv::waitKey(0x1e);
      } while (iVar3 < 0);
      apriltag_detector_destroy(td_00);
      iVar3 = strcmp(__s1,"tag36h11");
      if (iVar3 == 0) {
        tag36h11_destroy(famname);
      }
      else {
        iVar3 = strcmp(__s1,"tag25h9");
        if (iVar3 == 0) {
          tag25h9_destroy(famname);
        }
        else {
          iVar3 = strcmp(__s1,"tag16h5");
          if (iVar3 == 0) {
            tag16h5_destroy(famname);
          }
          else {
            iVar3 = strcmp(__s1,"tagCircle21h7");
            if (iVar3 == 0) {
              tagCircle21h7_destroy(famname);
            }
            else {
              iVar3 = strcmp(__s1,"tagCircle49h12");
              if (iVar3 == 0) {
                tagCircle49h12_destroy(famname);
              }
              else {
                iVar3 = strcmp(__s1,"tagStandard41h12");
                if (iVar3 == 0) {
                  tagStandard41h12_destroy(famname);
                }
                else {
                  iVar3 = strcmp(__s1,"tagStandard52h13");
                  if (iVar3 == 0) {
                    tagStandard52h13_destroy(famname);
                  }
                }
              }
            }
          }
        }
      }
      getopt_destroy(uVar5);
      argv_local._4_4_ = 0;
      cv::Mat::~Mat(local_138);
      cv::Mat::~Mat(local_d8);
    }
    cv::VideoCapture::~VideoCapture(local_50);
    return argv_local._4_4_;
  }
  printf("Usage: %s [options]\n",*argv);
  getopt_do_usage();
  exit(0);
}

Assistant:

int main(int argc, char *argv[])
{
    getopt_t *getopt = getopt_create();

    getopt_add_bool(getopt, 'h', "help", 0, "Show this help");
    getopt_add_bool(getopt, 'd', "debug", 1, "Enable debugging output (slow)");
    getopt_add_bool(getopt, 'q', "quiet", 0, "Reduce output");
    getopt_add_string(getopt, 'f', "family", "tag36h11", "Tag family to use");
    getopt_add_int(getopt, 't', "threads", "1", "Use this many CPU threads");
    getopt_add_double(getopt, 'x', "decimate", "1.0", "Decimate input image by this factor");
    getopt_add_double(getopt, 'b', "blur", "0.0", "Apply low-pass blur to input");
    getopt_add_bool(getopt, '0', "refine-edges", 1, "Spend more time trying to align edges of tags");

    if (!getopt_parse(getopt, argc, argv, 1) ||
            getopt_get_bool(getopt, "help")) {
        printf("Usage: %s [options]\n", argv[0]);
        getopt_do_usage(getopt);
        exit(0);
    }

    // Initialize camera
    VideoCapture cap(0);
    if (!cap.isOpened()) {
        cerr << "Couldn't open video capture device" << endl;
        return -1;
    }

    // Initialize tag detector with options
    apriltag_family_t *tf = NULL;
    const char *famname = getopt_get_string(getopt, "family");
    if (!strcmp(famname, "tag36h11")) {
        tf = tag36h11_create();
    } else if (!strcmp(famname, "tag25h9")) {
        tf = tag25h9_create();
    } else if (!strcmp(famname, "tag16h5")) {
        tf = tag16h5_create();
    } else if (!strcmp(famname, "tagCircle21h7")) {
        tf = tagCircle21h7_create();
    } else if (!strcmp(famname, "tagCircle49h12")) {
        tf = tagCircle49h12_create();
    } else if (!strcmp(famname, "tagStandard41h12")) {
        tf = tagStandard41h12_create();
    } else if (!strcmp(famname, "tagStandard52h13")) {
        tf = tagStandard52h13_create();
    } else {
        printf("Unrecognized tag family name. Use e.g. \"tag36h11\".\n");
        exit(-1);
    }


    apriltag_detector_t *td = apriltag_detector_create();
    apriltag_detector_add_family(td, tf);
    td->quad_decimate = getopt_get_double(getopt, "decimate");
    td->quad_sigma = getopt_get_double(getopt, "blur");
    td->nthreads = getopt_get_int(getopt, "threads");
    td->debug = getopt_get_bool(getopt, "debug");
    td->refine_edges = getopt_get_bool(getopt, "refine-edges");

    Mat frame, gray;
    while (true) {
        cap >> frame;
        cvtColor(frame, gray, COLOR_BGR2GRAY);

        // Make an image_u8_t header for the Mat data
        image_u8_t im = { .width = gray.cols,
            .height = gray.rows,
            .stride = gray.cols,
            .buf = gray.data
        };

        zarray_t *detections = apriltag_detector_detect(td, &im);
        cout << zarray_size(detections) << " tags detected" << endl;

        // Draw detection outlines
        for (int i = 0; i < zarray_size(detections); i++) {
            apriltag_detection_t *det;
            zarray_get(detections, i, &det);
            line(frame, Point(det->p[0][0], det->p[0][1]),
                     Point(det->p[1][0], det->p[1][1]),
                     Scalar(0, 0xff, 0), 2);
            line(frame, Point(det->p[0][0], det->p[0][1]),
                     Point(det->p[3][0], det->p[3][1]),
                     Scalar(0, 0, 0xff), 2);
            line(frame, Point(det->p[1][0], det->p[1][1]),
                     Point(det->p[2][0], det->p[2][1]),
                     Scalar(0xff, 0, 0), 2);
            line(frame, Point(det->p[2][0], det->p[2][1]),
                     Point(det->p[3][0], det->p[3][1]),
                     Scalar(0xff, 0, 0), 2);

            stringstream ss;
            ss << det->id;
            String text = ss.str();
            int fontface = FONT_HERSHEY_SCRIPT_SIMPLEX;
            double fontscale = 1.0;
            int baseline;
            Size textsize = getTextSize(text, fontface, fontscale, 2,
                                            &baseline);
            putText(frame, text, Point(det->c[0]-textsize.width/2,
                                       det->c[1]+textsize.height/2),
                    fontface, fontscale, Scalar(0xff, 0x99, 0), 2);
        }
        zarray_destroy(detections);

        imshow("Tag Detections", frame);
        if (waitKey(30) >= 0)
            break;
    }

    apriltag_detector_destroy(td);

    if (!strcmp(famname, "tag36h11")) {
        tag36h11_destroy(tf);
    } else if (!strcmp(famname, "tag25h9")) {
        tag25h9_destroy(tf);
    } else if (!strcmp(famname, "tag16h5")) {
        tag16h5_destroy(tf);
    } else if (!strcmp(famname, "tagCircle21h7")) {
        tagCircle21h7_destroy(tf);
    } else if (!strcmp(famname, "tagCircle49h12")) {
        tagCircle49h12_destroy(tf);
    } else if (!strcmp(famname, "tagStandard41h12")) {
        tagStandard41h12_destroy(tf);
    } else if (!strcmp(famname, "tagStandard52h13")) {
        tagStandard52h13_destroy(tf);
    }


    getopt_destroy(getopt);

    return 0;
}